

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

int __thiscall Ptex::v2_2::StringKey::copy(StringKey *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char *__dest;
  char *newval;
  
  __dest = (char *)operator_new__((ulong)(*(int *)(dst + 8) + 1));
  memcpy(__dest,*(void **)dst,(ulong)(*(int *)(dst + 8) + 1));
  this->_val = __dest;
  this->_len = *(uint32_t *)(dst + 8);
  this->_hash = *(uint32_t *)(dst + 0xc);
  this->_ownsVal = true;
  return (int)this;
}

Assistant:

void copy(volatile StringKey& key) volatile
    {
        char* newval = new char[key._len+1];
        memcpy(newval, key._val, key._len+1);
        _val = newval;
        _len = key._len;
        _hash = key._hash;
        _ownsVal = true;
    }